

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  char cVar1;
  uchar uVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  char *pcVar7;
  char *__s;
  undefined7 in_register_00000031;
  curl_slist *pcVar8;
  char *pcVar9;
  long lVar10;
  curl_slist *h [2];
  long local_58;
  curl_slist *local_48 [2];
  connectdata *local_38;
  
  local_38 = data->conn;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    local_48[0] = (data->set).headers;
    local_58 = 1;
    if ((((ulong)data->conn->bits & 9) == 1) && (((data->set).field_0x8ca & 8) != 0)) {
      local_48[1] = (data->set).proxyheaders;
      local_58 = 2;
    }
  }
  else {
    if (((data->set).field_0x8ca & 8) == 0) {
      local_48[0] = (data->set).headers;
    }
    else {
      local_48[0] = (data->set).proxyheaders;
    }
    local_58 = 1;
  }
  lVar10 = 0;
  do {
    pcVar8 = local_48[lVar10];
LAB_001333bc:
    if (pcVar8 != (curl_slist *)0x0) {
      __s = pcVar8->data;
      pcVar6 = strchr(__s,0x3a);
      if (pcVar6 != (char *)0x0) goto LAB_001333df;
      pcVar6 = strchr(__s,0x3b);
      pcVar9 = pcVar6;
      pcVar7 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        do {
          cVar1 = pcVar7[1];
          if ((cVar1 != '\t') && (cVar1 != ' ')) {
            if (cVar1 == '\0') goto LAB_001335be;
            if (3 < (byte)(cVar1 - 10U)) goto LAB_001335b0;
          }
          pcVar9 = pcVar9 + 1;
          pcVar7 = pcVar7 + 1;
        } while( true );
      }
      goto LAB_001335b4;
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == local_58) {
      return CURLE_OK;
    }
  } while( true );
LAB_001335b0:
  if (cVar1 != '\0') goto LAB_001335b4;
LAB_001335be:
  if (*pcVar7 == ';') {
    pcVar7 = (*Curl_cstrdup)(__s);
    if (pcVar7 == (char *)0x0) {
      Curl_dyn_free(req);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar9[(long)pcVar7 - (long)pcVar8->data] = ':';
    __s = pcVar8->data;
    pcVar6 = pcVar9 + ((long)pcVar7 - (long)__s);
  }
  else {
LAB_001333df:
    pcVar7 = (char *)0x0;
  }
  if (pcVar6 == __s) goto LAB_001335b4;
  do {
    do {
      pcVar6 = pcVar6 + 1;
      cVar1 = *pcVar6;
    } while (cVar1 == '\t');
  } while ((cVar1 == ' ') || ((cVar1 != '\0' && ((byte)(cVar1 - 10U) < 4))));
  if ((pcVar7 == (char *)0x0) && (cVar1 == '\0')) goto LAB_001335b4;
  if (pcVar7 != (char *)0x0) {
    __s = pcVar7;
  }
  if (((data->state).aptr.host == (char *)0x0) ||
     (iVar4 = curl_strnequal(__s,"Host:",5), iVar4 == 0)) {
    uVar2 = (data->state).httpreq;
    if (uVar2 == '\x02') {
      iVar4 = curl_strnequal(__s,"Content-Type:",0xd);
      if (iVar4 != 0) goto LAB_00133597;
      uVar2 = (data->state).httpreq;
    }
    if ((((((uVar2 == '\x03') && (iVar4 = curl_strnequal(__s,"Content-Type:",0xd), iVar4 != 0)) ||
          ((((data->req).field_0xdb & 4) != 0 &&
           (iVar4 = curl_strnequal(__s,"Content-Length:",0xf), iVar4 != 0)))) ||
         (((data->state).aptr.te != (char *)0x0 &&
          (iVar4 = curl_strnequal(__s,"Connection:",0xb), iVar4 != 0)))) ||
        ((0x13 < local_38->httpversion &&
         (iVar4 = curl_strnequal(__s,"Transfer-Encoding:",0x12), iVar4 != 0)))) ||
       (((iVar4 = curl_strnequal(__s,"Authorization:",0xe), iVar4 != 0 ||
         (iVar4 = curl_strnequal(__s,"Cookie:",7), iVar4 != 0)) &&
        (_Var3 = Curl_auth_allowed_to_host(data), !_Var3)))) goto LAB_00133597;
    CVar5 = Curl_dyn_addf(req,"%s\r\n",__s);
  }
  else {
LAB_00133597:
    CVar5 = CURLE_OK;
  }
  if (pcVar7 != (char *)0x0) {
    (*Curl_cfree)(pcVar7);
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
LAB_001335b4:
  pcVar8 = pcVar8->next;
  goto LAB_001333bc;
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr && (ptr != headers->data)) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, do not pass on any custom
                Host: header as that will produce *two* in the same
                request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->req.authneg &&
                  /* while doing auth neg, do not allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, do not pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 does not support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  !Curl_auth_allowed_to_host(data))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}